

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RedBlackTree.cpp
# Opt level: O3

void __thiscall RedBlackTree::merge(RedBlackTree *this,RedBlackTree *RedBlackTree2)

{
  int iVar1;
  Node *pNVar2;
  Node *extraout_RDX;
  Node *extraout_RDX_00;
  Node *extraout_RDX_01;
  Node *pNVar3;
  int iVar4;
  int data;
  Node *pNVar5;
  RedBlackTree *this_00;
  Node *pNVar6;
  Node *pNVar7;
  bool bVar8;
  Node *node;
  Node *c;
  Node *local_48;
  Node *local_40;
  int local_34;
  
  pNVar6 = this->root;
  pNVar7 = RedBlackTree2->root;
  iVar1 = 0;
  iVar4 = 0;
  if (pNVar6 != (Node *)0x0) {
    iVar4 = 0;
    pNVar2 = pNVar6;
    do {
      iVar4 = iVar4 + (uint)(pNVar2->color == 1);
      pNVar2 = pNVar2->left;
    } while (pNVar2 != (Node *)0x0);
  }
  if (pNVar7 != (Node *)0x0) {
    iVar1 = 0;
    pNVar2 = pNVar7;
    do {
      iVar1 = iVar1 + (uint)(pNVar2->color == 1);
      pNVar2 = pNVar2->left;
    } while (pNVar2 != (Node *)0x0);
  }
  if (iVar1 < iVar4) {
    do {
      pNVar2 = pNVar6;
      this_00 = this;
      pNVar6 = pNVar2->right;
    } while (pNVar2->right != (Node *)0x0);
  }
  else {
    if (iVar4 < iVar1) {
      do {
        pNVar2 = pNVar7;
        pNVar7 = pNVar2->left;
      } while (pNVar2->left != (Node *)0x0);
      data = pNVar2->value;
      local_40 = pNVar2;
      local_48 = deleteBST(this,&RedBlackTree2->root,data);
      fixDelete(RedBlackTree2,&local_48);
      pNVar7 = RedBlackTree2->root;
      pNVar3 = extraout_RDX_00;
      goto LAB_0010656d;
    }
    do {
      pNVar2 = pNVar7;
      pNVar7 = pNVar2->left;
    } while (pNVar2->left != (Node *)0x0);
    local_34 = pNVar2->value;
    local_40 = pNVar2;
    local_48 = deleteBST(this,&RedBlackTree2->root,local_34);
    fixDelete(RedBlackTree2,&local_48);
    iVar1 = 0;
    pNVar7 = RedBlackTree2->root;
    pNVar3 = extraout_RDX_01;
    for (pNVar5 = pNVar7; pNVar5 != (Node *)0x0; pNVar5 = pNVar5->left) {
      bVar8 = pNVar5->color == 1;
      pNVar3 = (Node *)(ulong)bVar8;
      iVar1 = iVar1 + (uint)bVar8;
    }
    data = local_34;
    if (iVar4 == iVar1) goto LAB_0010656d;
    this_00 = RedBlackTree2;
    insertElement(RedBlackTree2,pNVar2->value);
    pNVar7 = RedBlackTree2->root;
    do {
      pNVar2 = pNVar6;
      pNVar6 = pNVar2->right;
    } while (pNVar2->right != (Node *)0x0);
  }
  data = pNVar2->value;
  local_40 = pNVar2;
  local_48 = deleteBST(this_00,&this->root,data);
  fixDelete(this,&local_48);
  pNVar6 = this->root;
  pNVar3 = extraout_RDX;
LAB_0010656d:
  pNVar2->color = 0;
  iVar4 = 0;
  iVar1 = 0;
  if (pNVar6 != (Node *)0x0) {
    iVar1 = 0;
    pNVar3 = pNVar6;
    do {
      iVar1 = iVar1 + (uint)(pNVar3->color == 1);
      pNVar3 = pNVar3->left;
    } while (pNVar3 != (Node *)0x0);
  }
  if (pNVar7 != (Node *)0x0) {
    iVar4 = 0;
    pNVar3 = pNVar7;
    do {
      iVar4 = iVar4 + (uint)(pNVar3->color == 1);
      pNVar3 = pNVar3->left;
    } while (pNVar3 != (Node *)0x0);
  }
  if (iVar1 == iVar4) {
    pNVar2->left = pNVar6;
    pNVar6->parent = pNVar2;
    pNVar2->right = pNVar7;
    pNVar7->parent = pNVar2;
    pNVar2->color = 1;
    pNVar2->value = data;
    this->root = pNVar2;
    return;
  }
  local_48 = pNVar6;
  pNVar5 = pNVar7;
  if (iVar4 <= iVar1) {
    while( true ) {
      iVar1 = 0;
      for (pNVar5 = local_48; pNVar5 != (Node *)0x0; pNVar5 = pNVar5->left) {
        iVar1 = iVar1 + (uint)(pNVar5->color == 1);
      }
      if (iVar4 == iVar1) break;
      local_48 = local_48->right;
    }
    pNVar5 = local_48->parent;
    pNVar2->right = pNVar7;
    pNVar7->parent = pNVar2;
    pNVar2->left = local_48;
    local_48->parent = pNVar2;
    pNVar5->right = pNVar2;
    pNVar2->parent = pNVar5;
    if (pNVar5->color == 0) {
      fixInsert(this,&local_40);
      pNVar2 = local_40;
    }
    else if (local_48->color == 0) {
      fixInsert(this,&local_48);
    }
    pNVar2->value = data;
    this->root = pNVar6;
    return;
  }
  do {
    if (pNVar5 == (Node *)0x0) {
      if (iVar1 == 0) {
        local_48 = (Node *)0x0;
        goto LAB_001066c7;
      }
    }
    else {
      iVar4 = 0;
      pNVar3 = pNVar5;
      do {
        iVar4 = iVar4 + (uint)(pNVar3->color == 1);
        pNVar3 = pNVar3->left;
      } while (pNVar3 != (Node *)0x0);
      if (iVar1 == iVar4) break;
    }
    pNVar3 = pNVar5;
    pNVar5 = pNVar5->left;
  } while( true );
  pNVar3 = pNVar5->parent;
  local_48 = pNVar5;
LAB_001066c7:
  pNVar2->left = pNVar6;
  if (pNVar6 != (Node *)0x0) {
    pNVar6->parent = pNVar2;
  }
  pNVar2->right = pNVar5;
  if (pNVar5 == (Node *)0x0) {
    pNVar3->left = pNVar2;
    pNVar2->parent = pNVar3;
    if (pNVar3->color != 0) goto LAB_00106740;
  }
  else {
    pNVar5->parent = pNVar2;
    pNVar3->left = pNVar2;
    pNVar2->parent = pNVar3;
    if (pNVar3->color != 0) {
      if (pNVar5->color == 0) {
        fixInsert(this,&local_48);
      }
      goto LAB_00106740;
    }
  }
  fixInsert(this,&local_40);
  pNVar2 = local_40;
LAB_00106740:
  pNVar2->value = data;
  this->root = pNVar7;
  return;
}

Assistant:

void RedBlackTree::merge(RedBlackTree RedBlackTree2) {
    int temp;
    Node *c, *temp_ptr;
    Node *root1 = root;
    Node *root2 = RedBlackTree2.root;

    int initialblackheight1 = getBlackHeight(root1);
    int initialblackheight2 = getBlackHeight(root2);
    if (initialblackheight1 > initialblackheight2) {
        c = findMax(root1);
        temp = c->value;
        removeElement(c->value);
        root1 = root;
    } else if (initialblackheight2 > initialblackheight1) {
        c = findMin(root2);
        temp = c->value;
        RedBlackTree2.removeElement(c->value);
        root2 = RedBlackTree2.root;
    } else {
        c = findMin(root2);
        temp = c->value;
        RedBlackTree2.removeElement(c->value);
        root2 = RedBlackTree2.root;
        if (initialblackheight1 != getBlackHeight(root2)) {
            RedBlackTree2.insertElement(c->value);
            root2 = RedBlackTree2.root;
            c = findMax(root1);
            temp = c->value;
            removeElement(c->value);
            root1 = root;
        }
    }
    setColor(c, RED);

    int finalblackheight1 = getBlackHeight(root1);
    int finalblackheight2 = getBlackHeight(root2);
    if (finalblackheight1 == finalblackheight2) {
        c->left = root1;
        root1->parent = c;
        c->right = root2;
        root2->parent = c;
        setColor(c, BLACK);
        c->value = temp;
        root = c;
    } else if (finalblackheight2 > finalblackheight1) {
        Node *ptr = root2;
        while (finalblackheight1 != getBlackHeight(ptr)) {
            temp_ptr = ptr;
            ptr = ptr->left;
        }
        Node *ptr_parent;
        if (ptr == nullptr) {
            ptr_parent = temp_ptr;
        } else {
            ptr_parent = ptr->parent;
        }
        c->left = root1;
        if (root1 != nullptr) {
            root1->parent = c;
        }
        c->right = ptr;
        if (ptr != nullptr) {
            ptr->parent = c;
        }
        ptr_parent->left = c;
        c->parent = ptr_parent;
        if (getColor(ptr_parent) == RED) {
            {
                fixInsert(c);
            }
        } else if (getColor(ptr) == RED) {
            fixInsert(ptr);
        }
        c->value = temp;
        root = root2;
    } else {
        Node *ptr = root1;
        while (finalblackheight2 != getBlackHeight(ptr)) {
            ptr = ptr->right;
        }
        Node *ptr_parent = ptr->parent;
        c->right = root2;
        root2->parent = c;
        c->left = ptr;
        ptr->parent = c;
        ptr_parent->right = c;
        c->parent = ptr_parent;
        if (getColor(ptr_parent) == RED) {
            fixInsert(c);
        } else if (getColor(ptr) == RED) {
            fixInsert(ptr);
        }
        c->value = temp;
        root = root1;
    }
}